

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VL1Norm(N_Vector X,sunindextype param_2,sunindextype global_length,int myid)

{
  realtype rVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  timespec spec;
  timespec local_30;
  
  N_VConst(-1.0,X);
  clock_gettime(4,&local_30);
  lVar2 = local_30.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_30.tv_nsec;
  rVar1 = N_VL1Norm(X);
  sync_device();
  clock_gettime(4,&local_30);
  lVar3 = local_30.tv_sec - base_time_tv_sec;
  if (0.0 <= rVar1) {
    if (ABS((rVar1 - (double)global_length) / (double)global_length) <= 1e-15) {
      iVar4 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VL1Norm ");
        iVar4 = 0;
      }
      goto LAB_00106078;
    }
  }
  printf(">>> FAILED test -- N_VL1Norm, Proc %d \n",(ulong)(uint)myid);
  iVar4 = 1;
LAB_00106078:
  dVar5 = max_time(X,((double)local_30.tv_nsec / 1000000000.0 + (double)lVar3) -
                     (dVar5 / 1000000000.0 + (double)lVar2));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar5,0),"N_VL1Norm");
  }
  return iVar4;
}

Assistant:

int Test_N_VL1Norm(N_Vector X, sunindextype local_length,
                   sunindextype global_length, int myid)
{
  int      fails = 0, failure = 0;
  double   start_time, stop_time, maxt;
  realtype ans;

  /* fill vector data */
  N_VConst(NEG_ONE, X);

  start_time = get_time();
  ans = N_VL1Norm(X);
  sync_device();
  stop_time = get_time();

  /* ans should equal global_length */
  failure = (ans < ZERO) ? 1 : FNEQ(ans, global_length);

  if (failure) {
    printf(">>> FAILED test -- N_VL1Norm, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VL1Norm \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VL1Norm", maxt);

  return(fails);
}